

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>::
findFirstOverlap(NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_>
                 *this,uint32_t i,uint32_t size,interval<unsigned_long> *key)

{
  ulong uVar1;
  BranchNode<unsigned_long,_8U,_true> *self;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_true>_> *pNVar2;
  
  uVar1 = (ulong)i;
  pNVar2 = this + uVar1 * 0x10 + 0x48;
  while( true ) {
    if (size <= uVar1) {
      return size;
    }
    if (key->right < *(ulong *)(pNVar2 + -8)) break;
    if (key->left <= *(ulong *)pNVar2) {
      return (uint32_t)uVar1;
    }
    uVar1 = uVar1 + 1;
    pNVar2 = pNVar2 + 0x10;
  }
  return size;
}

Assistant:

uint32_t findFirstOverlap(uint32_t i, uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(i <= size);
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);

        for (; i < size; i++) {
            // Our left values are ordered, so if our right is before the
            // current left then there's no way anything here overlaps.
            auto curr = self.keyAt(i);
            if (curr.left > key.right)
                break;

            if (curr.right >= key.left)
                return i;
        }

        return size;
    }